

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O1

void __thiscall
burst::k_ary_search_set<int,std::greater<void>>::
initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (k_ary_search_set<int,std::greater<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *range)

{
  ulong *puVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  k_ary_search_set_branch *pkVar5;
  int *piVar6;
  long lVar7;
  unsigned_long uVar8;
  pointer puVar9;
  int *piVar10;
  _Elt_pointer pkVar11;
  ulong *puVar12;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> counters;
  value_type branch;
  stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
  branches;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  k_ary_search_set_branch local_c8;
  k_ary_search_set_branch local_a8;
  _Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
  local_88;
  
  piVar3 = (range->
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
           ).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin._M_current;
  piVar4 = (range->
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
           ).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End._M_current;
  piVar10 = piVar4;
  piVar6 = piVar3;
  if (piVar3 != piVar4) {
    do {
      piVar13 = piVar6 + 1;
      piVar10 = piVar4;
      if (piVar13 == piVar4) break;
      iVar2 = *piVar6;
      piVar10 = piVar6;
      piVar6 = piVar13;
    } while (*piVar13 < iVar2);
  }
  if (piVar10 != piVar4) {
    __assert_fail("std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                  ,0x149,
                  "void burst::k_ary_search_set<int, std::greater<void>>::initialize_trusted(const RandomAccessRange &) [Value = int, Compare = std::greater<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>]"
                 );
  }
  if (piVar3 != piVar4) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)this,(long)piVar4 - (long)piVar3 >> 2);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
    _M_initialize_map(&local_88,0);
    local_c8.index = 0;
    local_c8.size = *(long *)(this + 8) - *(long *)this >> 2;
    uVar8 = intlog<unsigned_long,unsigned_long>(local_c8.size,*(unsigned_long *)(this + 0x18));
    local_c8.height = uVar8 + 1;
    local_c8.preceding_elements = 0;
    std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
    emplace_back<burst::k_ary_search_set_branch>
              ((deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                *)&local_88,&local_c8);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pkVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_c8.index = pkVar5[0xf].index;
          local_c8.size = pkVar5[0xf].size;
          local_c8.height = pkVar5[0xf].height;
          local_c8.preceding_elements = pkVar5[0xf].preceding_elements;
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x10;
          pkVar11 = local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0xf;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          pkVar11 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          local_c8.index = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].index;
          local_c8.size = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].size;
          local_c8.height = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].height;
          local_c8.preceding_elements =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].preceding_elements;
        }
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (ulong *)0x0;
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = pkVar11;
        k_ary_search_set<int,_std::greater<void>_>::fill_counters
                  ((k_ary_search_set<int,_std::greater<void>_> *)this,&local_c8,&local_e8);
        fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                  (this,&local_c8,&local_e8,range);
        if (*local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start != 0) {
          local_a8.index = (*(long *)(this + 0x18) + local_c8.index * *(long *)(this + 0x18)) - 1;
          local_a8.size =
               *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
          local_a8.height = local_c8.height - 1;
          local_a8.preceding_elements = local_c8.preceding_elements;
          std::
          deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
          emplace_back<burst::k_ary_search_set_branch>
                    ((deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                      *)&local_88,&local_a8);
        }
        if ((8 < (ulong)((long)local_e8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start)) &&
           (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[1] !=
            *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + 1)) {
          puVar12 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
          puVar9 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar14 = 1;
          uVar15 = 2;
          do {
            local_a8.index =
                 (*(long *)(this + 0x18) + -1) * uVar15 + local_c8.index * *(long *)(this + 0x18);
            local_a8.size = ~*puVar9 + *puVar12;
            local_a8.height = local_c8.height - 1;
            local_a8.preceding_elements = *puVar9 + local_c8.preceding_elements + 1;
            std::
            deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
            emplace_back<burst::k_ary_search_set_branch>
                      ((deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                        *)&local_88,&local_a8);
            if ((ulong)((long)local_e8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar15) break;
            puVar12 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar14 + 1;
            lVar7 = uVar15 - 1;
            puVar9 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar14;
            puVar1 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar15;
            lVar14 = lVar14 + 1;
            uVar15 = uVar15 + 1;
          } while (*puVar1 !=
                   local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar7] + 1);
        }
        if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (ulong *)0x0) {
          operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    _Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
    ~_Deque_base(&local_88);
  }
  return;
}

Assistant:

void initialize_trusted (const RandomAccessRange & range)
        {
            BOOST_ASSERT
            (
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()
            );
            if (not range.empty())
            {
                m_values.resize(range.size());

                std::stack<k_ary_search_set_branch> branches;

                branches.push({0, size(), perfect_tree_height(m_arity, size()), 0});
                while (not branches.empty())
                {
                    const auto branch = branches.top();
                    branches.pop();

                    // Количество меньших элементов ветки для каждого элемента текущего узла.
                    std::vector<std::size_t> counters;
                    fill_counters(branch, counters);

                    fill_node(branch, counters, range);

                    if (counters[0] > 0)
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, 0),
                            counters[0],
                            branch.height - 1,
                            branch.preceding_elements
                        });
                    }

                    for
                    (
                        std::size_t i = 1;
                        i < counters.size() && (counters[i] - counters[i - 1] - 1) > 0;
                        ++i
                    )
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, i),
                            counters[i] - counters[i - 1] - 1,
                            branch.height - 1,
                            branch.preceding_elements + counters[i - 1] + 1
                        });
                    }
                }
            }
        }